

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

void __thiscall SSD1306::OledI2C::OledI2C(OledI2C *this,string *device,uint8_t address)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  int iVar3;
  char *__file;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_DL;
  EVP_PKEY_CTX *ctx;
  OledI2C *in_RDI;
  string what_1;
  string what;
  FileDescriptor *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  FileDescriptor *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  string local_1a0 [24];
  string *in_stack_fffffffffffffe78;
  error_category *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe8c;
  system_error *in_stack_fffffffffffffe90;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [207];
  byte local_11;
  
  local_11 = in_DL;
  OledHardware::OledHardware(&in_RDI->super_OledHardware);
  OledPixel::OledPixel(&in_RDI->super_OledPixel);
  (in_RDI->super_OledHardware)._vptr_OledHardware = (_func_int **)&PTR__OledI2C_00110bf0;
  (in_RDI->super_OledPixel)._vptr_OledPixel = (_func_int **)&PTR__OledI2C_00110c80;
  std::function<bool(int)>::
  function<SSD1306::FileDescriptor::FileDescriptor(int,std::function<bool(int)>)::_default_arg_1_::_lambda(int)_1_,void>
            ((function<bool_(int)> *)in_stack_fffffffffffffe00,
             (anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  FileDescriptor::FileDescriptor
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
             (CloseIfFunction *)in_stack_fffffffffffffdf0);
  std::function<bool_(int)>::~function((function<bool_(int)> *)0x1091a0);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI->blocks_;
  memset(__rhs,0,0x440);
  __lhs = __rhs + 0x440;
  pbVar1 = __rhs;
  do {
    local_1c0 = pbVar1;
    PixelBlock::PixelBlock((PixelBlock *)in_stack_fffffffffffffdf0);
    pbVar1 = local_1c0 + 0x22;
  } while (local_1c0 + 0x22 != __lhs);
  __file = (char *)std::__cxx11::string::c_str();
  iVar2 = open(__file,2);
  std::function<bool(int)>::
  function<SSD1306::FileDescriptor::FileDescriptor(int,std::function<bool(int)>)::_default_arg_1_::_lambda(int)_1_,void>
            ((function<bool_(int)> *)in_stack_fffffffffffffe00,
             (anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  FileDescriptor::FileDescriptor
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
             (CloseIfFunction *)in_stack_fffffffffffffdf0);
  FileDescriptor::operator=
            (in_stack_fffffffffffffe00,
             (FileDescriptor *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  FileDescriptor::~FileDescriptor(in_stack_fffffffffffffdf0);
  std::function<bool_(int)>::~function((function<bool_(int)> *)0x109282);
  iVar3 = FileDescriptor::fd(&in_RDI->fd_);
  if (iVar3 == -1) {
    std::operator+((char *)__lhs,__rhs);
    iVar3 = (int)((ulong)__lhs >> 0x20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (char *)in_stack_fffffffffffffdf0);
    std::__cxx11::to_string(iVar3);
    std::operator+(local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffe20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (char *)in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    uVar4 = __cxa_allocate_exception(0x20);
    __errno_location();
    std::_V2::system_category();
    std::system_error::system_error
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78);
    __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  iVar2 = FileDescriptor::fd(&in_RDI->fd_);
  __val = (int)((ulong)__lhs >> 0x20);
  ctx = (EVP_PKEY_CTX *)0x703;
  iVar3 = ioctl(iVar2,0x703,(ulong)local_11);
  if (iVar3 == -1) {
    std::__cxx11::to_string(__val);
    std::operator+((char *)CONCAT44(iVar2,in_stack_fffffffffffffdf8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdf0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffdf8),(char *)in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
    std::__cxx11::string::~string(local_1a0);
    uVar4 = __cxa_allocate_exception(0x20);
    __errno_location();
    std::_V2::system_category();
    std::system_error::system_error
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78);
    __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  init(in_RDI,ctx);
  return;
}

Assistant:

SSD1306::OledI2C::OledI2C(
    const std::string& device,
    uint8_t address)
:
    fd_{-1},
    blocks_{}
{
    fd_ = FileDescriptor{::open(device.c_str(), O_RDWR)};

    if (fd_.fd() == -1)
    {
        std::string what( "open "
                        + device
                        + " " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }

    if (ioctl(fd_.fd(), I2C_SLAVE, address) == -1)
    {
        std::string what( "ioctl I2C_SLAVE " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }

    init();
}